

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyBufferToImage
          (VulkanCommandBuffer *this,VkBuffer srcBuffer,VkImage dstImage,
          VkImageLayout dstImageLayout,uint32_t regionCount,VkBufferImageCopy *pRegions)

{
  Char *Message;
  undefined4 in_register_0000000c;
  undefined1 local_50 [8];
  string msg;
  VkBufferImageCopy *pRegions_local;
  uint32_t regionCount_local;
  VkImageLayout dstImageLayout_local;
  VkImage dstImage_local;
  VkBuffer srcBuffer_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = pRegions;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,dstImageLayout));
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CopyBufferToImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x21b);
    std::__cxx11::string::~string((string *)local_50);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyBufferToImage)
            (this->m_VkCmdBuffer,srcBuffer,dstImage,dstImageLayout,regionCount,
             (VkBufferImageCopy *)msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void CopyBufferToImage(VkBuffer                 srcBuffer,
                                         VkImage                  dstImage,
                                         VkImageLayout            dstImageLayout,
                                         uint32_t                 regionCount,
                                         const VkBufferImageCopy* pRegions)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyBufferToImage(m_VkCmdBuffer, srcBuffer, dstImage, dstImageLayout, regionCount, pRegions);
    }